

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STDAllocator.hpp
# Opt level: O2

void __thiscall
std::_Bvector_base<Diligent::STDAllocator<bool,_Diligent::IMemoryAllocator>_>::_Bvector_base
          (_Bvector_base<Diligent::STDAllocator<bool,_Diligent::IMemoryAllocator>_> *this,
          allocator_type *__a)

{
  Int32 IVar1;
  Char *pCVar2;
  Char *pCVar3;
  
  pCVar2 = __a->m_dvpFileName;
  IVar1 = __a->m_dvpLineNumber;
  pCVar3 = __a->m_dvpDescription;
  (this->_M_impl).super__Bit_alloc_type.m_Allocator = __a->m_Allocator;
  (this->_M_impl).super__Bit_alloc_type.m_dvpDescription = pCVar3;
  (this->_M_impl).super__Bit_alloc_type.m_dvpFileName = pCVar2;
  (this->_M_impl).super__Bit_alloc_type.m_dvpLineNumber = IVar1;
  (this->_M_impl).super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0
  ;
  (this->_M_impl).super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->_M_impl).super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  (this->_M_impl).super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->_M_impl).super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  return;
}

Assistant:

STDAllocator(const STDAllocator<U, AllocatorType>& other) noexcept :
        // clang-format off
        m_Allocator     {other.m_Allocator}
#ifdef DILIGENT_DEVELOPMENT
      , m_dvpDescription{other.m_dvpDescription}
      , m_dvpFileName   {other.m_dvpFileName   }
      , m_dvpLineNumber {other.m_dvpLineNumber }
#endif
    // clang-format on
    {
    }